

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_catcher_test.cpp
# Opt level: O2

void __thiscall
AllCatcher_Tests::Internal_catch_handler_all_catcher_works::test_method
          (Internal_catch_handler_all_catcher_works *this)

{
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Internal_catch_handler_all_catcher_works)
{
   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, all_catcher(EXIT_FAILURE, UnHandler<int>()).handleException());
      }
   }
}